

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_type_extension.cpp
# Opt level: O1

bool __thiscall duckdb::DBConfig::HasArrowExtension(DBConfig *this,LogicalType *type)

{
  int iVar1;
  pthread_mutex_t *__mutex;
  pointer pAVar2;
  mapped_type *pmVar3;
  unique_ptr<duckdb::ArrowTypeExtensionSet,_std::default_delete<duckdb::ArrowTypeExtensionSet>,_true>
  *this_00;
  bool bVar4;
  TypeInfo type_info;
  TypeInfo local_48;
  
  this_00 = &this->arrow_extensions;
  __mutex = (pthread_mutex_t *)
            unique_ptr<duckdb::ArrowTypeExtensionSet,_std::default_delete<duckdb::ArrowTypeExtensionSet>,_true>
            ::operator->(this_00);
  iVar1 = pthread_mutex_lock(__mutex);
  if (iVar1 == 0) {
    TypeInfo::TypeInfo(&local_48,type);
    pAVar2 = unique_ptr<duckdb::ArrowTypeExtensionSet,_std::default_delete<duckdb::ArrowTypeExtensionSet>,_true>
             ::operator->(this_00);
    pmVar3 = ::std::__detail::
             _Map_base<duckdb::TypeInfo,_std::pair<const_duckdb::TypeInfo,_duckdb::vector<duckdb::ArrowExtensionMetadata,_true>_>,_std::allocator<std::pair<const_duckdb::TypeInfo,_duckdb::vector<duckdb::ArrowExtensionMetadata,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::TypeInfo>,_duckdb::HashTypeInfo,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<duckdb::TypeInfo,_std::pair<const_duckdb::TypeInfo,_duckdb::vector<duckdb::ArrowExtensionMetadata,_true>_>,_std::allocator<std::pair<const_duckdb::TypeInfo,_duckdb::vector<duckdb::ArrowExtensionMetadata,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::TypeInfo>,_duckdb::HashTypeInfo,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&pAVar2->type_to_info,&local_48);
    bVar4 = true;
    if ((pmVar3->
        super_vector<duckdb::ArrowExtensionMetadata,_std::allocator<duckdb::ArrowExtensionMetadata>_>
        ).
        super__Vector_base<duckdb::ArrowExtensionMetadata,_std::allocator<duckdb::ArrowExtensionMetadata>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (pmVar3->
        super_vector<duckdb::ArrowExtensionMetadata,_std::allocator<duckdb::ArrowExtensionMetadata>_>
        ).
        super__Vector_base<duckdb::ArrowExtensionMetadata,_std::allocator<duckdb::ArrowExtensionMetadata>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_48.type = ANY;
      pAVar2 = unique_ptr<duckdb::ArrowTypeExtensionSet,_std::default_delete<duckdb::ArrowTypeExtensionSet>,_true>
               ::operator->(this_00);
      pmVar3 = ::std::__detail::
               _Map_base<duckdb::TypeInfo,_std::pair<const_duckdb::TypeInfo,_duckdb::vector<duckdb::ArrowExtensionMetadata,_true>_>,_std::allocator<std::pair<const_duckdb::TypeInfo,_duckdb::vector<duckdb::ArrowExtensionMetadata,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::TypeInfo>,_duckdb::HashTypeInfo,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<duckdb::TypeInfo,_std::pair<const_duckdb::TypeInfo,_duckdb::vector<duckdb::ArrowExtensionMetadata,_true>_>,_std::allocator<std::pair<const_duckdb::TypeInfo,_duckdb::vector<duckdb::ArrowExtensionMetadata,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::TypeInfo>,_duckdb::HashTypeInfo,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&pAVar2->type_to_info,&local_48);
      bVar4 = (pmVar3->
              super_vector<duckdb::ArrowExtensionMetadata,_std::allocator<duckdb::ArrowExtensionMetadata>_>
              ).
              super__Vector_base<duckdb::ArrowExtensionMetadata,_std::allocator<duckdb::ArrowExtensionMetadata>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              (pmVar3->
              super_vector<duckdb::ArrowExtensionMetadata,_std::allocator<duckdb::ArrowExtensionMetadata>_>
              ).
              super__Vector_base<duckdb::ArrowExtensionMetadata,_std::allocator<duckdb::ArrowExtensionMetadata>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48.alias._M_dataplus._M_p != &local_48.alias.field_2) {
      operator_delete(local_48.alias._M_dataplus._M_p);
    }
    pthread_mutex_unlock(__mutex);
    return bVar4;
  }
  ::std::__throw_system_error(iVar1);
}

Assistant:

bool DBConfig::HasArrowExtension(const LogicalType &type) const {
	lock_guard<mutex> l(arrow_extensions->lock);
	TypeInfo type_info(type);
	if (!arrow_extensions->type_to_info[type_info].empty()) {
		return true;
	}
	type_info.type = LogicalTypeId::ANY;
	return !arrow_extensions->type_to_info[type_info].empty();
}